

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int pager_link_page(Pager *pPager,Page *pPage)

{
  sxu32 sVar1;
  uint uVar2;
  Page **pSrc;
  uint local_34;
  sxu32 iBucket;
  sxu32 n;
  Page **apNew;
  Page *pEntry;
  sxu32 nNewSize;
  sxu32 nBucket;
  Page *pPage_local;
  Pager *pPager_local;
  
  uVar2 = (uint)pPage->pgno & pPager->nSize - 1;
  pPage->pNextCollide = pPager->apHash[uVar2];
  if (pPager->apHash[uVar2] != (Page *)0x0) {
    pPager->apHash[uVar2]->pPrevCollide = pPage;
  }
  pPager->apHash[uVar2] = pPage;
  if (pPager->pAll == (Page *)0x0) {
    pPager->pAll = pPage;
  }
  else {
    pPage->pNext = pPager->pAll;
    pPager->pAll->pPrev = pPage;
    pPager->pAll = pPage;
  }
  pPager->nPage = pPager->nPage + 1;
  if ((pPager->nSize << 2 <= pPager->nPage) && (pPager->nPage < 100000)) {
    sVar1 = pPager->nSize;
    pSrc = (Page **)SyMemBackendAlloc(pPager->pAllocator,sVar1 << 4);
    if (pSrc != (Page **)0x0) {
      SyZero(pSrc,sVar1 << 4);
      local_34 = 0;
      apNew = (Page **)pPager->pAll;
      for (; local_34 < pPager->nPage; local_34 = local_34 + 1) {
        apNew[10] = (Page *)0x0;
        apNew[9] = (Page *)0x0;
        uVar2 = (uint)apNew[2] & sVar1 * 2 - 1;
        apNew[9] = pSrc[uVar2];
        if (pSrc[uVar2] != (Page *)0x0) {
          pSrc[uVar2]->pPrevCollide = (Page *)apNew;
        }
        pSrc[uVar2] = (Page *)apNew;
        apNew = (Page **)apNew[5];
      }
      SyMemBackendFree(pPager->pAllocator,pPager->apHash);
      pPager->apHash = pSrc;
      pPager->nSize = sVar1 * 2;
    }
  }
  return 0;
}

Assistant:

static int pager_link_page(Pager *pPager,Page *pPage)
{
	sxu32 nBucket;
	/* Install in the corresponding bucket */
	nBucket = PAGE_HASH(pPage->pgno) & (pPager->nSize - 1);
	pPage->pNextCollide = pPager->apHash[nBucket];
	if( pPager->apHash[nBucket] ){
		pPager->apHash[nBucket]->pPrevCollide = pPage;
	}
	pPager->apHash[nBucket] = pPage;
	/* Link to the list of active pages */
	MACRO_LD_PUSH(pPager->pAll,pPage);
	pPager->nPage++;
	if( (pPager->nPage >= pPager->nSize * 4)  && pPager->nPage < 100000 ){
		/* Grow the hashtable */
		sxu32 nNewSize = pPager->nSize << 1;
		Page *pEntry,**apNew;
		sxu32 n;
		apNew = (Page **)SyMemBackendAlloc(pPager->pAllocator, nNewSize * sizeof(Page *));
		if( apNew ){
			sxu32 iBucket;
			/* Zero the new table */
			SyZero((void *)apNew, nNewSize * sizeof(Page *));
			/* Rehash all entries */
			n = 0;
			pEntry = pPager->pAll;
			for(;;){
				/* Loop one */
				if( n >= pPager->nPage ){
					break;
				}
				pEntry->pNextCollide = pEntry->pPrevCollide = 0;
				/* Install in the new bucket */
				iBucket = PAGE_HASH(pEntry->pgno) & (nNewSize - 1);
				pEntry->pNextCollide = apNew[iBucket];
				if( apNew[iBucket] ){
					apNew[iBucket]->pPrevCollide = pEntry;
				}
				apNew[iBucket] = pEntry;
				/* Point to the next entry */
				pEntry = pEntry->pNext;
				n++;
			}
			/* Release the old table and reflect the change */
			SyMemBackendFree(pPager->pAllocator,(void *)pPager->apHash);
			pPager->apHash = apNew;
			pPager->nSize  = nNewSize;
		}
	}
	return UNQLITE_OK;
}